

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O0

void __thiscall flow::diagnostics::Report::tokenError<>(Report *this,SourceLocation *sloc,string *f)

{
  string_view local_88;
  string local_78;
  SourceLocation local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *f_local;
  SourceLocation *sloc_local;
  Report *this_local;
  
  local_20 = f;
  f_local = &sloc->filename;
  sloc_local = (SourceLocation *)this;
  SourceLocation::SourceLocation(&local_58,sloc);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>(&local_88,local_20);
  fmt::v5::format<>(&local_78,local_88);
  emplace_back(this,TokenError,&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  SourceLocation::~SourceLocation(&local_58);
  return;
}

Assistant:

void tokenError(const SourceLocation& sloc, const std::string& f, Args... args) {
    emplace_back(Type::TokenError, sloc, fmt::format(f, std::move(args)...));
  }